

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GrcSymTable.cpp
# Opt level: O2

void __thiscall GrcSymbolTable::InitGlyphMetrics(GrcSymbolTable *this)

{
  Symbol pGVar1;
  allocator local_28a;
  allocator local_289;
  GrcStructName local_288;
  string local_270;
  string local_250;
  string local_230;
  string local_210;
  string local_1f0;
  string local_1d0;
  string local_1b0;
  string local_190;
  string local_170;
  string local_150;
  string local_130;
  string local_110;
  string local_f0;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  string local_30;
  
  std::__cxx11::string::string((string *)&local_30,"boundingbox",&local_28a);
  std::__cxx11::string::string((string *)&local_50,"top",&local_289);
  GrcStructName::GrcStructName(&local_288,&local_30,&local_50);
  pGVar1 = PreDefineSymbol(this,&local_288,ksymtGlyphMetric,kexptMeas,kprecNone);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_288.m_vstaFields);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&local_30);
  pGVar1->m_fGeneric = true;
  std::__cxx11::string::string((string *)&local_70,"boundingbox",&local_28a);
  std::__cxx11::string::string((string *)&local_90,"bottom",&local_289);
  GrcStructName::GrcStructName(&local_288,&local_70,&local_90);
  pGVar1 = PreDefineSymbol(this,&local_288,ksymtGlyphMetric,kexptMeas,kprecNone);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_288.m_vstaFields);
  std::__cxx11::string::~string((string *)&local_90);
  std::__cxx11::string::~string((string *)&local_70);
  pGVar1->m_fGeneric = true;
  std::__cxx11::string::string((string *)&local_b0,"boundingbox",&local_28a);
  std::__cxx11::string::string((string *)&local_d0,"left",&local_289);
  GrcStructName::GrcStructName(&local_288,&local_b0,&local_d0);
  pGVar1 = PreDefineSymbol(this,&local_288,ksymtGlyphMetric,kexptMeas,kprecNone);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_288.m_vstaFields);
  std::__cxx11::string::~string((string *)&local_d0);
  std::__cxx11::string::~string((string *)&local_b0);
  pGVar1->m_fGeneric = true;
  std::__cxx11::string::string((string *)&local_f0,"boundingbox",&local_28a);
  std::__cxx11::string::string((string *)&local_110,"right",&local_289);
  GrcStructName::GrcStructName(&local_288,&local_f0,&local_110);
  pGVar1 = PreDefineSymbol(this,&local_288,ksymtGlyphMetric,kexptMeas,kprecNone);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_288.m_vstaFields);
  std::__cxx11::string::~string((string *)&local_110);
  std::__cxx11::string::~string((string *)&local_f0);
  pGVar1->m_fGeneric = true;
  std::__cxx11::string::string((string *)&local_130,"boundingbox",&local_28a);
  std::__cxx11::string::string((string *)&local_150,"height",&local_289);
  GrcStructName::GrcStructName(&local_288,&local_130,&local_150);
  pGVar1 = PreDefineSymbol(this,&local_288,ksymtGlyphMetric,kexptMeas,kprecNone);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_288.m_vstaFields);
  std::__cxx11::string::~string((string *)&local_150);
  std::__cxx11::string::~string((string *)&local_130);
  pGVar1->m_fGeneric = true;
  std::__cxx11::string::string((string *)&local_170,"boundingbox",&local_28a);
  std::__cxx11::string::string((string *)&local_190,"width",&local_289);
  GrcStructName::GrcStructName(&local_288,&local_170,&local_190);
  pGVar1 = PreDefineSymbol(this,&local_288,ksymtGlyphMetric,kexptMeas,kprecNone);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_288.m_vstaFields);
  std::__cxx11::string::~string((string *)&local_190);
  std::__cxx11::string::~string((string *)&local_170);
  pGVar1->m_fGeneric = true;
  std::__cxx11::string::string((string *)&local_1b0,"advanceheight",&local_28a);
  GrcStructName::GrcStructName(&local_288,&local_1b0);
  pGVar1 = PreDefineSymbol(this,&local_288,ksymtGlyphMetric,kexptMeas,kprecNone);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_288.m_vstaFields);
  std::__cxx11::string::~string((string *)&local_1b0);
  pGVar1->m_fGeneric = true;
  std::__cxx11::string::string((string *)&local_1d0,"advancewidth",&local_28a);
  GrcStructName::GrcStructName(&local_288,&local_1d0);
  pGVar1 = PreDefineSymbol(this,&local_288,ksymtGlyphMetric,kexptMeas,kprecNone);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_288.m_vstaFields);
  std::__cxx11::string::~string((string *)&local_1d0);
  pGVar1->m_fGeneric = true;
  std::__cxx11::string::string((string *)&local_1f0,"leftsidebearing",&local_28a);
  GrcStructName::GrcStructName(&local_288,&local_1f0);
  pGVar1 = PreDefineSymbol(this,&local_288,ksymtGlyphMetric,kexptMeas,kprecNone);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_288.m_vstaFields);
  std::__cxx11::string::~string((string *)&local_1f0);
  pGVar1->m_fGeneric = true;
  std::__cxx11::string::string((string *)&local_210,"rightsidebearing",&local_28a);
  GrcStructName::GrcStructName(&local_288,&local_210);
  pGVar1 = PreDefineSymbol(this,&local_288,ksymtGlyphMetric,kexptMeas,kprecNone);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_288.m_vstaFields);
  std::__cxx11::string::~string((string *)&local_210);
  pGVar1->m_fGeneric = true;
  std::__cxx11::string::string((string *)&local_230,"ascent",&local_28a);
  GrcStructName::GrcStructName(&local_288,&local_230);
  pGVar1 = PreDefineSymbol(this,&local_288,ksymtGlyphMetric,kexptMeas,kprecNone);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_288.m_vstaFields);
  std::__cxx11::string::~string((string *)&local_230);
  pGVar1->m_fGeneric = true;
  std::__cxx11::string::string((string *)&local_250,"descent",&local_28a);
  GrcStructName::GrcStructName(&local_288,&local_250);
  pGVar1 = PreDefineSymbol(this,&local_288,ksymtGlyphMetric,kexptMeas,kprecNone);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_288.m_vstaFields);
  std::__cxx11::string::~string((string *)&local_250);
  pGVar1->m_fGeneric = true;
  std::__cxx11::string::string((string *)&local_270,"munits",&local_28a);
  GrcStructName::GrcStructName(&local_288,&local_270);
  pGVar1 = PreDefineSymbol(this,&local_288,ksymtGlyphMetric,kexptNumber,kprecNone);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_288.m_vstaFields);
  std::__cxx11::string::~string((string *)&local_270);
  pGVar1->m_fGeneric = true;
  return;
}

Assistant:

void GrcSymbolTable::InitGlyphMetrics()
{
	SymbolType kst = ksymtGlyphMetric;

	Symbol psym;
	psym = PreDefineSymbol(GrcStructName("boundingbox", "top"),	kst, kexptMeas);
	psym->m_fGeneric = true;
	psym = PreDefineSymbol(GrcStructName("boundingbox", "bottom"),	kst, kexptMeas);
	psym->m_fGeneric = true;
	psym = PreDefineSymbol(GrcStructName("boundingbox", "left"),	kst, kexptMeas);
	psym->m_fGeneric = true;
	psym = PreDefineSymbol(GrcStructName("boundingbox", "right"),	kst, kexptMeas);
	psym->m_fGeneric = true;
	psym = PreDefineSymbol(GrcStructName("boundingbox", "height"),	kst, kexptMeas);
	psym->m_fGeneric = true;
	psym = PreDefineSymbol(GrcStructName("boundingbox", "width"),	kst, kexptMeas);
	psym->m_fGeneric = true;

	psym = PreDefineSymbol(GrcStructName("advanceheight"),		kst, kexptMeas);
	psym->m_fGeneric = true;
	psym = PreDefineSymbol(GrcStructName("advancewidth"),		kst, kexptMeas);
	psym->m_fGeneric = true;

	psym = PreDefineSymbol(GrcStructName("leftsidebearing"),	kst, kexptMeas);
	psym->m_fGeneric = true;
	psym = PreDefineSymbol(GrcStructName("rightsidebearing"),	kst, kexptMeas);	// = munits - lsb
	psym->m_fGeneric = true;

	psym = PreDefineSymbol(GrcStructName("ascent"),	kst, kexptMeas);
	psym->m_fGeneric = true;
	psym = PreDefineSymbol(GrcStructName("descent"),	kst, kexptMeas);	// = font height - ascent
	psym->m_fGeneric = true;
	psym = PreDefineSymbol(GrcStructName("munits"),	kst, kexptNumber);
	psym->m_fGeneric = true;
}